

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cymric.cpp
# Opt level: O0

int cymric_random(cymric_rng *R,void *buffer,int bytes)

{
  uint32_t uVar1;
  int iVar2;
  uint *puVar3;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  blake2b_state state;
  uint32_t c0;
  uint32_t *iv_mix;
  chacha_iv *iv;
  chacha_key *key;
  uint64_t in_stack_fffffffffffffdc8;
  uint8_t *in_stack_fffffffffffffdd0;
  blake2b_state *in_stack_fffffffffffffdd8;
  uint8_t in_stack_fffffffffffffdff;
  blake2b_state *in_stack_fffffffffffffe00;
  blake2b_state *in_stack_fffffffffffffe08;
  undefined1 auStack_1e0 [32];
  size_t in_stack_fffffffffffffe40;
  size_t in_stack_fffffffffffffe48;
  uint8_t *in_stack_fffffffffffffe50;
  uint8_t *in_stack_fffffffffffffe58;
  chacha_iv *in_stack_fffffffffffffe60;
  chacha_key *in_stack_fffffffffffffe68;
  int local_54;
  
  if (((in_RDI == 0) || (in_RSI == 0)) || (in_EDX < 1)) {
    local_54 = -1;
  }
  else if (((*(char *)(in_RDI + 0x40) == 'S') && (*(char *)(in_RDI + 0x41) == 'E')) &&
          ((*(char *)(in_RDI + 0x42) == 'E' && (*(char *)(in_RDI + 0x43) == 'D')))) {
    puVar3 = (uint *)(in_RDI + 0x20);
    uVar1 = GetCPUCycles();
    *puVar3 = uVar1 ^ *puVar3;
    uVar1 = unix_gettid();
    *(uint32_t *)(in_RDI + 0x24) = uVar1 ^ *(uint *)(in_RDI + 0x24);
    uVar1 = get_counter();
    *puVar3 = (uVar1 << 0xd | uVar1 >> 0x13) + *puVar3;
    chacha(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
           in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    uVar1 = GetCPUCycles();
    *(uint32_t *)(in_RDI + 0x24) = uVar1 + *(int *)(in_RDI + 0x24);
    iVar2 = blake2b_init(in_stack_fffffffffffffe00,in_stack_fffffffffffffdff);
    if (iVar2 == 0) {
      iVar2 = blake2b_update(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                             in_stack_fffffffffffffdc8);
      if (iVar2 == 0) {
        iVar2 = blake2b_final(in_stack_fffffffffffffe08,(uint8_t *)in_stack_fffffffffffffe00,
                              in_stack_fffffffffffffdff);
        if (iVar2 == 0) {
          secure_zero_memory(auStack_1e0,0x100);
          local_54 = 0;
        }
        else {
          local_54 = -5;
        }
      }
      else {
        local_54 = -4;
      }
    }
    else {
      local_54 = -3;
    }
  }
  else {
    local_54 = -2;
  }
  return local_54;
}

Assistant:

int cymric_random(
    cymric_rng* R,  ///< [in] Generator to use
    void* buffer,   ///< [in, out] Buffer to fill with random bytes
    int bytes       ///< [in] Number of bytes to fill
) {
    static const int CHACHA_ROUNDS = 12;

    // Validate input
    if (!R || !buffer || bytes <= 0)
        return -1;

    // If R was not seeded:
    if (R->internal[64] != 'S' || R->internal[65] != 'E' ||
        R->internal[66] != 'E' || R->internal[67] != 'D') {
        return -2;
    }

    // Use low 32 bytes as a key for ChaCha20
    chacha_key *key = (chacha_key *)R->internal;

    // Use next 8 bytes as an IV for ChaCha20, reserving the top 24 bytes
    chacha_iv *iv = (chacha_iv *)(R->internal + 32);

    // Mix in some fast entropy sources
    uint32_t *iv_mix = (uint32_t *)iv;

#ifdef CYMRIC_CYCLES
    {
        // Mix in initial cycle count
        iv_mix[0] ^= GetCPUCycles();
    }
#endif

#ifndef CYMRIC_UNINIT
    CAT_MEMCLR(buffer, bytes);
#endif

#ifdef CYMRIC_GETTID
    {
        // Mix in thread id
        iv_mix[1] ^= unix_gettid();
    }
#endif

#ifdef CYMRIC_WINTID
    {
        // Mix in thread id
        iv_mix[1] ^= GetCurrentThreadId();
    }
#endif

#ifdef CYMRIC_PTHREADS
    {
        // Mix in pthread self id
        pthread_t myself = pthread_self();
        const uint32_t *words = (const uint32_t *)&myself;
        iv_mix[1] ^= words[0];
        if (sizeof(myself) > 4) {
            iv_mix[0] += words[1];
        }
    }
#endif

#ifdef CYMRIC_COUNTER
    {
        // Mix in incrementing counter
        const uint32_t c0 = get_counter();
        iv_mix[0] += CAT_ROL32(c0, 13);
    }
#endif

    // Note this is "encrypting" the uninitialized buffer with random
    // bytes from the ChaCha20 function.  Valgrind is not going to like
    // this but it is intentional
    chacha(key, iv, (const uint8_t *)buffer, (uint8_t *)buffer, bytes, CHACHA_ROUNDS);

#ifdef CYMRIC_CYCLES
    {
        // Mix in final cycle count
        iv_mix[1] += GetCPUCycles();
    }
#endif

    blake2b_state state;

    // Iterate the hash to erase the ChaCha20 key material
    if (blake2b_init(&state, 64))
        return -3;
    if (blake2b_update(&state, (const uint8_t *)R->internal, 64))
        return -4;
    if (blake2b_final(&state, (uint8_t *)R->internal, 64))
        return -5;

    CAT_SECURE_OBJCLR(state.buf);

    return 0;
}